

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLChar.cpp
# Opt level: O3

bool xercesc_4_0::XMLChar1_0::isValidName(XMLCh *toCheck)

{
  XMLCh XVar1;
  XMLCh *pXVar2;
  
  if (((&fgCharCharsTable1_0)[(ushort)*toCheck] & 2) != 0) {
    pXVar2 = toCheck + 1;
    do {
      XVar1 = *pXVar2;
      pXVar2 = pXVar2 + 1;
    } while (((&fgCharCharsTable1_0)[(ushort)XVar1] & 4) != 0);
    if (XVar1 == L'\0') {
      return true;
    }
  }
  return false;
}

Assistant:

bool XMLChar1_0::isValidName(const   XMLCh* const    toCheck)
{
    const XMLCh* curCh = toCheck;

    if ((fgCharCharsTable1_0[*curCh++] & gFirstNameCharMask))
	{
		while ((fgCharCharsTable1_0[*curCh] & gNameCharMask))
		{
			curCh++;
		}

		if (*curCh == 0)
		{
			return true;
		}
	}
	return false;
}